

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void DLevelScript::ReplaceTextures(int fromnamei,int tonamei,int flags)

{
  char *name;
  bool local_7b;
  bool local_7a;
  bool local_79;
  FTextureID local_74;
  int local_70;
  FTextureID local_6c;
  sector_t *local_68;
  sector_t *sec;
  int i_1;
  int local_54;
  FTextureID local_50;
  int local_4c;
  side_t *psStack_48;
  int j;
  side_t *wal;
  int local_38;
  int i;
  FTextureID local_30;
  FTextureID local_2c;
  FTextureID picnum2;
  FTextureID picnum1;
  char *toname;
  char *fromname;
  int flags_local;
  int tonamei_local;
  int fromnamei_local;
  
  name = FBehavior::StaticLookupString(fromnamei);
  _picnum2 = FBehavior::StaticLookupString(tonamei);
  FTextureID::FTextureID(&local_2c);
  FTextureID::FTextureID(&local_30);
  if (name != (char *)0x0) {
    if (flags != 7) {
      i = (int)FTextureManager::GetTexture(&TexMan,name,1,2);
      local_2c = (FTextureID)i;
      local_38 = (int)FTextureManager::GetTexture(&TexMan,_picnum2,1,2);
      local_30 = (FTextureID)local_38;
      for (wal._4_4_ = 0; wal._4_4_ < numsides; wal._4_4_ = wal._4_4_ + 1) {
        psStack_48 = sides + wal._4_4_;
        for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
          local_79 = false;
          if ((flags & (uint)ReplaceTextures::bits[local_4c]) == 0) {
            local_50 = side_t::GetTexture(psStack_48,local_4c);
            local_79 = FTextureID::operator==(&local_50,&local_2c);
          }
          if (local_79 != false) {
            local_54 = local_30.texnum;
            side_t::SetTexture(psStack_48,local_4c,local_30);
          }
        }
      }
    }
    if (flags != 0x18) {
      i_1 = (int)FTextureManager::GetTexture(&TexMan,name,2,2);
      local_2c = (FTextureID)i_1;
      sec._4_4_ = FTextureManager::GetTexture(&TexMan,_picnum2,2,2);
      local_30 = sec._4_4_;
      for (sec._0_4_ = 0; (int)sec < numsectors; sec._0_4_ = (int)sec + 1) {
        local_68 = sectors + (int)sec;
        local_7a = false;
        if ((flags & 8U) == 0) {
          local_6c = sector_t::GetTexture(local_68,0);
          local_7a = FTextureID::operator==(&local_6c,&local_2c);
        }
        if (local_7a != false) {
          local_70 = local_30.texnum;
          sector_t::SetTexture(local_68,0,local_30,true);
        }
        local_7b = false;
        if ((flags & 0x10U) == 0) {
          local_74 = sector_t::GetTexture(local_68,1);
          local_7b = FTextureID::operator==(&local_74,&local_2c);
        }
        if (local_7b != false) {
          sector_t::SetTexture(local_68,1,local_30,true);
        }
      }
    }
  }
  return;
}

Assistant:

void DLevelScript::ReplaceTextures (int fromnamei, int tonamei, int flags)
{
	const char *fromname = FBehavior::StaticLookupString (fromnamei);
	const char *toname = FBehavior::StaticLookupString (tonamei);
	FTextureID picnum1, picnum2;

	if (fromname == NULL)
		return;

	if ((flags ^ (NOT_BOTTOM | NOT_MIDDLE | NOT_TOP)) != 0)
	{
		picnum1 = TexMan.GetTexture (fromname, FTexture::TEX_Wall, FTextureManager::TEXMAN_Overridable);
		picnum2 = TexMan.GetTexture (toname, FTexture::TEX_Wall, FTextureManager::TEXMAN_Overridable);

		for (int i = 0; i < numsides; ++i)
		{
			side_t *wal = &sides[i];

			for(int j=0;j<3;j++)
			{
				static BYTE bits[]={NOT_TOP, NOT_MIDDLE, NOT_BOTTOM};
				if (!(flags & bits[j]) && wal->GetTexture(j) == picnum1)
				{
					wal->SetTexture(j, picnum2);
				}
			}
		}
	}
	if ((flags ^ (NOT_FLOOR | NOT_CEILING)) != 0)
	{
		picnum1 = TexMan.GetTexture (fromname, FTexture::TEX_Flat, FTextureManager::TEXMAN_Overridable);
		picnum2 = TexMan.GetTexture (toname, FTexture::TEX_Flat, FTextureManager::TEXMAN_Overridable);

		for (int i = 0; i < numsectors; ++i)
		{
			sector_t *sec = &sectors[i];

			if (!(flags & NOT_FLOOR) && sec->GetTexture(sector_t::floor) == picnum1) 
				sec->SetTexture(sector_t::floor, picnum2);
			if (!(flags & NOT_CEILING) && sec->GetTexture(sector_t::ceiling) == picnum1)	
				sec->SetTexture(sector_t::ceiling, picnum2);
		}
	}
}